

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomHelper.h
# Opt level: O1

Teacher * GetRandom<Teacher>(vector<Teacher,_std::allocator<Teacher>_> *vec)

{
  result_type_conflict1 rVar1;
  uniform_int_distribution<int> distribution;
  param_type local_18;
  
  local_18 = (param_type)
             ((ulong)((int)((ulong)((long)(vec->
                                          super__Vector_base<Teacher,_std::allocator<Teacher>_>).
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(vec->super__Vector_base<Teacher,_std::allocator<Teacher>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 5) - 1) <<
             0x20);
  random_engine();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_18,&random_engine::smt,&local_18);
  return (vec->super__Vector_base<Teacher,_std::allocator<Teacher>_>)._M_impl.
         super__Vector_impl_data._M_start + rVar1;
}

Assistant:

static const T& GetRandom(const vector<T>& vec) {
    uniform_int_distribution<int> distribution(0, vec.size() - 1);
    size_t randomPos = distribution(random_engine());
    return vec[randomPos];
}